

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O2

LY_ERR lyd_print_fd(int fd,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  LY_ERR LVar1;
  ly_out *in_RAX;
  ly_out *out;
  
  if (fd == -1) {
    LVar1 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","fd != -1","lyd_print_fd")
    ;
  }
  else {
    out = in_RAX;
    LVar1 = ly_out_new_fd(fd,&out);
    if (LVar1 == LY_SUCCESS) {
      LVar1 = lyd_print_(out,root,format,options);
      ly_out_free(out,(_func_void_void_ptr *)0x0,'\0');
    }
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_print_fd(int fd, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_ERR ret;
    struct ly_out *out;

    LY_CHECK_ARG_RET(NULL, fd != -1, LY_EINVAL);

    LY_CHECK_RET(ly_out_new_fd(fd, &out));
    ret = lyd_print_(out, root, format, options);
    ly_out_free(out, NULL, 0);
    return ret;
}